

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void cs_sha1_final(uchar *digest,cs_sha1_ctx *context)

{
  uchar local_25;
  uchar local_24 [7];
  uchar c;
  uchar finalcount [8];
  uint i;
  cs_sha1_ctx *context_local;
  uchar *digest_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 8; finalcount._0_4_ = finalcount._0_4_ + 1) {
    local_24[(uint)finalcount._0_4_] =
         (uchar)(context->count[(int)(uint)((uint)finalcount._0_4_ < 4)] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  local_25 = 0x80;
  unique0x1000012d = context;
  cs_sha1_update(context,&local_25,1);
  while ((stack0xffffffffffffffe8->count[0] & 0x1f8) != 0x1c0) {
    local_25 = '\0';
    cs_sha1_update(stack0xffffffffffffffe8,&local_25,1);
  }
  cs_sha1_update(stack0xffffffffffffffe8,local_24,8);
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 0x14; finalcount._0_4_ = finalcount._0_4_ + 1) {
    digest[(uint)finalcount._0_4_] =
         (uchar)(stack0xffffffffffffffe8->state[(uint)finalcount._0_4_ >> 2] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  memset(stack0xffffffffffffffe8,0,0x5c);
  memset(local_24,0,8);
  return;
}

Assistant:

void cs_sha1_final(unsigned char digest[20], cs_sha1_ctx *context) {
    unsigned i;
    unsigned char finalcount[8], c;

    for (i = 0; i < 8; i++) {
        finalcount[i] = (unsigned char) ((context->count[(i >= 4 ? 0 : 1)] >>
                                          ((3 - (i & 3)) * 8)) &
                                         255);
    }
    c = 0200;
    cs_sha1_update(context, &c, 1);
    while ((context->count[0] & 504) != 448) {
        c = 0000;
        cs_sha1_update(context, &c, 1);
    }
    cs_sha1_update(context, finalcount, 8);
    for (i = 0; i < 20; i++) {
        digest[i] =
                (unsigned char) ((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
    }
    memset(context, '\0', sizeof(*context));
    memset(&finalcount, '\0', sizeof(finalcount));
}